

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL_mock::GLCompiledProgram::addUniqueAttribute
          (GLCompiledProgram *this,ShaderSpecAttribute *newAttribute)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pGVar2;
  size_t __n;
  pointer pcVar3;
  int iVar4;
  long *plVar5;
  size_type *psVar6;
  vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
  *this_00;
  pointer __rhs;
  bool bVar7;
  bool bVar8;
  string local_90;
  GLCompiledProgram *local_70;
  GLShaderAttribute local_68;
  
  __rhs = (this->attributes).
          super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_70 = this;
  do {
    bVar7 = __rhs == pGVar2;
    if (bVar7) {
LAB_00297a9e:
      this_00 = &local_70->attributes;
      paVar1 = &local_68.name.field_2;
      pcVar3 = (newAttribute->name)._M_dataplus._M_p;
      local_68.name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar3,pcVar3 + (newAttribute->name)._M_string_length);
      local_68.type = newAttribute->type;
      local_68.arrayCount = newAttribute->arrayCount;
      local_68.buff.
      super___shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_68.buff.
      super___shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      vector<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
      ::emplace_back<polyscope::render::backend_openGL_mock::GLShaderAttribute>(this_00,&local_68);
      if (local_68.buff.
          super___shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.buff.
                   super___shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_68.name._M_dataplus._M_p);
      }
      return;
    }
    __n = (__rhs->name)._M_string_length;
    if (__n == (newAttribute->name)._M_string_length) {
      if (__n == 0) {
        bVar8 = true;
      }
      else {
        iVar4 = bcmp((__rhs->name)._M_dataplus._M_p,(newAttribute->name)._M_dataplus._M_p,__n);
        bVar8 = iVar4 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if (bVar8) {
      if (__rhs->type != newAttribute->type) {
        std::operator+(&local_68.name,"attribute ",&__rhs->name);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        psVar6 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_90.field_2._M_allocated_capacity = *psVar6;
          local_90.field_2._8_8_ = plVar5[3];
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar6;
          local_90._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_90._M_string_length = plVar5[1];
        *plVar5 = (long)psVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        exception(&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.name._M_dataplus._M_p != &local_68.name.field_2) {
          operator_delete(local_68.name._M_dataplus._M_p);
        }
      }
      if (bVar8) {
        if (!bVar7) {
          return;
        }
        goto LAB_00297a9e;
      }
    }
    __rhs = __rhs + 1;
  } while( true );
}

Assistant:

void GLCompiledProgram::addUniqueAttribute(ShaderSpecAttribute newAttribute) {
  for (GLShaderAttribute& a : attributes) {
    if (a.name == newAttribute.name) {

      // if it occurs twice, confirm that the occurences match
      if (a.type != newAttribute.type)
        exception("attribute " + a.name + " appears twice in program with different types");

      return;
    }
  }
  attributes.push_back(GLShaderAttribute{newAttribute.name, newAttribute.type, newAttribute.arrayCount, nullptr});
}